

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O2

double S2::GetArea(S2ShapeIndex *index)

{
  int iVar1;
  undefined4 extraout_var;
  int i;
  uint uVar2;
  double dVar3;
  double local_18;
  
  local_18 = 0.0;
  uVar2 = 0;
  while( true ) {
    iVar1 = (*index->_vptr_S2ShapeIndex[2])(index);
    if (iVar1 <= (int)uVar2) break;
    iVar1 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)uVar2);
    if ((S2Shape *)CONCAT44(extraout_var,iVar1) != (S2Shape *)0x0) {
      dVar3 = GetArea((S2Shape *)CONCAT44(extraout_var,iVar1));
      local_18 = local_18 + dVar3;
    }
    uVar2 = uVar2 + 1;
  }
  return local_18;
}

Assistant:

double GetArea(const S2ShapeIndex& index) {
  double area = 0;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape) area += S2::GetArea(*shape);
  }
  return area;
}